

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::IsRetainedName(string *name)

{
  bool bVar1;
  int iVar2;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  undefined1 *local_18;
  string *local_10;
  string *name_local;
  
  local_10 = name;
  if (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&IsRetainedName(std::__cxx11::string_const&)::
                                 retained_names_abi_cxx11_);
    if (iVar2 != 0) {
      local_18 = IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_,
                 "new",&local_19);
      local_18 = (undefined1 *)0x8ef7b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 0x20),
                 "alloc",local_2d);
      local_18 = (undefined1 *)0x8ef7d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 0x40),
                 "copy",&local_2e);
      local_18 = (undefined1 *)0x8ef7f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 0x60),
                 "mutableCopy",&local_2f);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_);
    }
  }
  bVar1 = anon_unknown_0::IsSpecialName
                    (local_10,(string *)
                              IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_
                     ,4);
  return bVar1;
}

Assistant:

bool IsRetainedName(const std::string& name) {
  // List of prefixes from
  // http://developer.apple.com/library/mac/#documentation/Cocoa/Conceptual/MemoryMgmt/Articles/mmRules.html
  static const std::string retained_names[] = {"new", "alloc", "copy",
                                               "mutableCopy"};
  return IsSpecialName(name, retained_names,
                       sizeof(retained_names) / sizeof(retained_names[0]));
}